

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctionHandler.cpp
# Opt level: O1

bool __thiscall
ExpressionFunctionHandler::addUserFunction
          (ExpressionFunctionHandler *this,Identifier *name,
          vector<Identifier,_std::allocator<Identifier>_> *parameters,
          vector<Token,_std::allocator<Token>_> *content)

{
  pointer pcVar1;
  bool bVar2;
  _func_void *p_Var3;
  anon_class_80_3_66625fa0 executor;
  undefined1 *local_b8;
  long local_b0;
  undefined1 local_a8;
  undefined7 uStack_a7;
  long lStack_a0;
  vector<Identifier,_std::allocator<Identifier>_> local_98;
  vector<Token,_std::allocator<Token>_> local_80;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  long local_48;
  long local_40;
  undefined4 local_38;
  
  pcVar1 = (name->_name)._M_dataplus._M_p;
  local_b8 = &local_a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar1,pcVar1 + (name->_name)._M_string_length);
  std::vector<Identifier,_std::allocator<Identifier>_>::vector(&local_98,parameters);
  std::vector<Token,_std::allocator<Token>_>::vector(&local_80,content);
  local_58 = (code *)0x0;
  pcStack_50 = (code *)0x0;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  p_Var3 = (_func_void *)operator_new(0x50);
  *(_func_void **)p_Var3 = p_Var3 + 0x10;
  if (local_b8 == &local_a8) {
    *(long *)(p_Var3 + 0x10) = CONCAT71(uStack_a7,local_a8);
    *(long *)(p_Var3 + 0x18) = lStack_a0;
  }
  else {
    *(undefined1 **)p_Var3 = local_b8;
    *(long *)(p_Var3 + 0x10) = CONCAT71(uStack_a7,local_a8);
  }
  *(long *)(p_Var3 + 8) = local_b0;
  local_b0 = 0;
  local_a8 = 0;
  *(pointer *)(p_Var3 + 0x20) =
       local_98.super__Vector_base<Identifier,_std::allocator<Identifier>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)(p_Var3 + 0x28) =
       local_98.super__Vector_base<Identifier,_std::allocator<Identifier>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)(p_Var3 + 0x30) =
       local_98.super__Vector_base<Identifier,_std::allocator<Identifier>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_98.super__Vector_base<Identifier,_std::allocator<Identifier>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.super__Vector_base<Identifier,_std::allocator<Identifier>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<Identifier,_std::allocator<Identifier>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8 = &local_a8;
  std::vector<Token,_std::allocator<Token>_>::vector
            ((vector<Token,_std::allocator<Token>_> *)(p_Var3 + 0x38),&local_80);
  pcStack_50 = std::
               _Function_handler<ExpressionValue_(const_std::vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Core/ExpressionFunctionHandler.cpp:117:18)>
               ::_M_invoke;
  local_58 = std::
             _Function_handler<ExpressionValue_(const_std::vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Core/ExpressionFunctionHandler.cpp:117:18)>
             ::_M_manager;
  local_48 = (long)(parameters->super__Vector_base<Identifier,_std::allocator<Identifier>_>)._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)(parameters->super__Vector_base<Identifier,_std::allocator<Identifier>_>)._M_impl
                   .super__Vector_impl_data._M_start >> 5;
  local_38 = 0;
  local_68._M_unused._0_8_ = p_Var3;
  local_40 = local_48;
  bVar2 = registerEntry(this,name,(Entry *)&local_68);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  std::vector<Token,_std::allocator<Token>_>::~vector(&local_80);
  std::vector<Identifier,_std::allocator<Identifier>_>::~vector(&local_98);
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
  }
  return bVar2;
}

Assistant:

bool ExpressionFunctionHandler::addUserFunction(const Identifier &name, const std::vector<Identifier> &parameters, const std::vector<Token> &content)
{
	// Executor: Evaluate parameters and instantiate function content with parameter substitutions
	auto executor = [functionName=name, parameterNames=parameters, content](const std::vector<std::unique_ptr<ExpressionInternal>> &parameters) -> ExpressionValue
	{
		// evaluate parameters
		std::vector<ExpressionValue> params;
		params.reserve(parameters.size());

		for (size_t i = 0; i < parameters.size(); i++)
		{
			ExpressionValue result = parameters[i]->evaluate();
			if (!result.isValid())
			{
				Logger::queueError(Logger::Error, "%s: Invalid parameter %d", functionName, i+1);
				return result;
			}

			params.push_back(result);
		}

		// instantiate
		TokenStreamTokenizer tok;
		tok.init(content);

		for (size_t i = 0; i < parameters.size(); ++i)
		{
			const auto &paramName = parameterNames[i];
			const auto &paramValue = params[i];

			switch (paramValue.type)
			{
			case ExpressionValueType::Float:
				tok.registerReplacementFloat(paramName, paramValue.floatValue);
				break;
			case ExpressionValueType::String:
				tok.registerReplacementString(paramName, paramValue.strValue.string());
				break;
			case ExpressionValueType::Integer:
				tok.registerReplacementInteger(paramName, paramValue.intValue);
				break;
			case ExpressionValueType::Invalid: // will not occur, invalid results are caught above
				break;
			}
		}

		Expression result = parseExpression(tok, false);
		if (!result.isLoaded())
		{
			Logger::queueError(Logger::Error, "%s: Failed to parse user function expression", functionName);
			return {};
		}

		if (!tok.atEnd())
		{
			Logger::queueError(Logger::Error, "%s: Unconsumed tokens after parsing user function expresion", functionName);
			return {};
		}

		// evaluate expression
		return result.evaluate();
	};

	return registerEntry(name, Entry{std::move(executor), parameters.size(), parameters.size(), ExpFuncSafety::Unsafe});
}